

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O0

wchar_t get_pain_msg_code(monster *mon,wchar_t dam)

{
  int iVar1;
  wchar_t percentage;
  long tmp;
  long oldhp;
  long newhp;
  wchar_t msg_code;
  wchar_t dam_local;
  monster *mon_local;
  
  newhp._0_4_ = L'5';
  if (L'\0' < dam) {
    iVar1 = (int)(((long)mon->hp * 100) / ((long)mon->hp + (long)dam));
    if (iVar1 < 0x60) {
      if (iVar1 < 0x4c) {
        if (iVar1 < 0x33) {
          if (iVar1 < 0x24) {
            if (iVar1 < 0x15) {
              if (iVar1 < 0xb) {
                newhp._0_4_ = L'@';
              }
              else {
                newhp._0_4_ = L'?';
              }
            }
            else {
              newhp._0_4_ = L'>';
            }
          }
          else {
            newhp._0_4_ = L'=';
          }
        }
        else {
          newhp._0_4_ = L'<';
        }
      }
      else {
        newhp._0_4_ = L';';
      }
    }
    else {
      newhp._0_4_ = L':';
    }
  }
  return (wchar_t)newhp;
}

Assistant:

static int get_pain_msg_code(struct monster *mon, int dam)
{
	int msg_code = MON_MSG_UNHARMED;

	/* Calculate damage levels */
	if (dam > 0) {
		/* Note -- subtle fix -CFT */
		long newhp = (long)(mon->hp);
		long oldhp = newhp + (long)(dam);
		long tmp = (newhp * 100L) / oldhp;
		int percentage = (int)(tmp);

		if (percentage > 95)		msg_code = MON_MSG_95;
		else if (percentage > 75)	msg_code = MON_MSG_75;
		else if (percentage > 50)	msg_code = MON_MSG_50;
		else if (percentage > 35)	msg_code = MON_MSG_35;
		else if (percentage > 20)	msg_code = MON_MSG_20;
		else if (percentage > 10)	msg_code = MON_MSG_10;
		else				msg_code = MON_MSG_0;
	}
	return msg_code;
}